

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O2

int XMLNode_remove_attribute(XMLNode *node,int i_attr)

{
  int iVar1;
  XMLAttribute *__src;
  ulong uVar2;
  XMLAttribute *__dest;
  int iVar3;
  
  iVar3 = -1;
  if ((((node != (XMLNode *)0x0) && (uVar2 = (ulong)(uint)i_attr, -1 < i_attr)) &&
      (node->init_value == 0x19770522)) && (iVar1 = node->n_attributes, i_attr < iVar1)) {
    if (iVar1 == 1) {
      __dest = (XMLAttribute *)0x0;
    }
    else {
      __dest = (XMLAttribute *)malloc((ulong)(iVar1 - 1) * 0x18);
      if (__dest == (XMLAttribute *)0x0) {
        return -1;
      }
    }
    free(node->attributes[uVar2].name);
    free(node->attributes[uVar2].value);
    __src = node->attributes;
    if (__dest != (XMLAttribute *)0x0) {
      memcpy(__dest,__src,uVar2 * 0x18);
      memcpy(__dest + uVar2,__src + uVar2 + 1,(long)(~i_attr + node->n_attributes) * 0x18);
    }
    free(__src);
    node->attributes = __dest;
    iVar3 = node->n_attributes + -1;
    node->n_attributes = iVar3;
  }
  return iVar3;
}

Assistant:

int XMLNode_remove_attribute(XMLNode* node, int i_attr)
{
	XMLAttribute* pt;
	if (node == NULL || node->init_value != XML_INIT_DONE || i_attr < 0 || i_attr >= node->n_attributes)
		return -1;
	
	/* Before modifying first see if we run out of memory */
	if (node->n_attributes == 1)
		pt = NULL;
	else {
		pt = __malloc((node->n_attributes - 1) * sizeof(XMLAttribute));
		if (pt == NULL)
			return -1;
	}

	/* Can't fail anymore, free item */
	if (node->attributes[i_attr].name != NULL) __free(node->attributes[i_attr].name);
	if (node->attributes[i_attr].value != NULL) __free(node->attributes[i_attr].value);
	
	if (pt != NULL) {
		memcpy(pt, node->attributes, i_attr * sizeof(XMLAttribute));
		memcpy(&pt[i_attr], &node->attributes[i_attr + 1], (node->n_attributes - i_attr - 1) * sizeof(XMLAttribute));
	}
	if (node->attributes != NULL)
		__free(node->attributes);
	node->attributes = pt;
	node->n_attributes--;
	
	return node->n_attributes;
}